

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O3

void __thiscall cppnet::BlockMemoryPool::ReleaseHalf(BlockMemoryPool *this)

{
  pointer __src;
  pointer __dest;
  void *__ptr;
  pointer ppvVar1;
  ulong uVar2;
  ulong uVar3;
  iterator iter;
  
  __dest = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar3 = (long)ppvVar1 - (long)__dest >> 3;
  uVar2 = uVar3 >> 1;
  __src = __dest + 1;
  while( true ) {
    uVar3 = uVar3 - 1;
    if (__dest == ppvVar1) {
      return;
    }
    __ptr = *__dest;
    if (__src != ppvVar1) {
      memmove(__dest,__src,(long)ppvVar1 - (long)__src);
      ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar1 + -1;
    free(__ptr);
    ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__dest == ppvVar1) break;
    if (uVar3 <= uVar2) {
      return;
    }
  }
  return;
}

Assistant:

void BlockMemoryPool::ReleaseHalf() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    size_t size = _free_mem_vec.size();
    size_t hale = size / 2;
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end();) {
        void* mem = *iter;

        iter = _free_mem_vec.erase(iter);
        free(mem);
        
        size--;
        if (iter == _free_mem_vec.end() || size <= hale) {
            break;
        }
    }
}